

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O3

void __thiscall xe::ri::EglConfigSet::EglConfigSet(EglConfigSet *this)

{
  (this->super_Item).m_type = TYPE_EGLCONFIGSET;
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__EglConfigSet_0012e950;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  (this->description)._M_string_length = 0;
  (this->description).field_2._M_local_buf[0] = '\0';
  List::List(&this->configs);
  return;
}

Assistant:

EglConfigSet		(void) : Item(TYPE_EGLCONFIGSET) {}